

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall ComponentManager::LoadLibrary(ComponentManager *this,char *name)

{
  undefined8 uVar1;
  IModule *pIVar2;
  ModuleInfo *this_00;
  allocator<char> local_69;
  string local_68;
  ModuleInfo *local_48;
  ModuleInfo *info;
  void *handle;
  _func_IModule_ptr *GetModule;
  _func_ErrorCode_IComponentManager_ptr *LoadLibrary;
  IModule *pIStack_20;
  ErrorCode result;
  IModule *mod;
  char *name_local;
  ComponentManager *this_local;
  
  pIStack_20 = (IModule *)0x0;
  LoadLibrary._4_4_ = 0;
  mod = (IModule *)name;
  name_local = (char *)this;
  info = (ModuleInfo *)dlopen(name,1);
  pIVar2 = mod;
  if (info == (ModuleInfo *)0x0) {
    LoadLibrary._4_4_ = kLoadFailed;
    uVar1 = dlerror();
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x54,"Failed to open shared lib \"%s\": %s",pIVar2,uVar1);
  }
  else {
    GetModule = (_func_IModule_ptr *)dlsym(info,"JHCOM_LibraryEntry");
    handle = (void *)dlsym(info,"JHCOM_GetModule");
    if ((handle == (void *)0x0) || (GetModule == (_func_IModule_ptr *)0x0)) {
      LoadLibrary._4_4_ = kLoadFailed;
      jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                   ,0x5e,"Failed to get symbol");
    }
    else {
      pIVar2 = (*GetModule)(this);
      LoadLibrary._4_4_ = (ErrorCode)pIVar2;
      if (LoadLibrary._4_4_ == kNoError) {
        pIStack_20 = (IModule *)(*(code *)handle)();
        (*(code *)**(undefined8 **)pIStack_20)();
        (**(code **)(*(long *)pIStack_20 + 0x30))();
        this_00 = (ModuleInfo *)
                  operator_new(0x30,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                               ,0x6b);
        pIVar2 = mod;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,(char *)pIVar2,&local_69);
        ModuleInfo::ModuleInfo(this_00,&local_68,pIStack_20,info);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
        local_48 = this_00;
        JetHead::list<ComponentManager::ModuleInfo_*>::push_back(&this->mModules,&local_48);
      }
    }
  }
  return LoadLibrary._4_4_;
}

Assistant:

ErrorCode ComponentManager::LoadLibrary( const char *name )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	IModule *mod = NULL;
	ErrorCode result = kNoError;
	
	LOG_NOTICE( "Opening Library: %s", name );
	
	ErrorCode (*LoadLibrary)( IComponentManager *mgr );
	IModule *(*GetModule)();
	void *handle = dlopen( name, RTLD_LAZY );
	
	if ( handle == NULL )
	{
		result = kLoadFailed;
		LOG_WARN( "Failed to open shared lib \"%s\": %s", name, dlerror() );
	}
	else
	{
		LoadLibrary = (ErrorCode (*)(IComponentManager *mgr))dlsym( handle, "JHCOM_LibraryEntry" );
		GetModule = (IModule *(*)())dlsym( handle, "JHCOM_GetModule" );

		if ( GetModule == NULL || LoadLibrary == NULL )
		{
			result = kLoadFailed;
			LOG_WARN( "Failed to get symbol" );
		}
		else
		{
			LOG( "LoadLibrary is %p", LoadLibrary );
			LOG( "RegisterServices is %p", GetModule );
			result = LoadLibrary( this );
			
			if ( result == kNoError )
			{
				mod = GetModule();
				mod->AddRef();
				mod->loadComponents();
				ModuleInfo *info = jh_new ModuleInfo( name, mod, handle );
				mModules.push_back( info );
			}
		}
	}
	
	return result;
}